

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs)

{
  SizeType SVar1;
  SizeType SVar2;
  int iVar3;
  Ch *__s1;
  Ch *__s2;
  bool bVar4;
  
  if (((byte)this[0xf] & 4) == 0) {
    __assert_fail("IsString()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/document.h"
                  ,0x84a,
                  "bool rapidjson::GenericValue<rapidjson::UTF8<>>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((undefined1  [16])((undefined1  [16])rhs->data_ & (undefined1  [16])0x400000000000000) !=
      (undefined1  [16])0x0) {
    SVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this);
    SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(rhs);
    if (SVar1 == SVar2) {
      __s1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)this);
      __s2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(rhs);
      if (__s1 == __s2) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(__s1,__s2,(ulong)SVar1);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  __assert_fail("rhs.IsString()",
                "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/document.h"
                ,0x84b,
                "bool rapidjson::GenericValue<rapidjson::UTF8<>>::StringEqual(const GenericValue<Encoding, SourceAllocator> &) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsString() const { return (data_.f.flags & kStringFlag) != 0; }